

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O2

uint32_t helper_vfp_get_fpscr_aarch64(CPUARMState_conflict *env)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  
  uVar2 = (uint)((env->vfp).standard_fp_status.float_exception_flags |
                (env->vfp).fp_status.float_exception_flags);
  uVar3 = (env->vfp).fp_status_f16.float_exception_flags & 0xffffffbf | uVar2;
  uVar5 = uVar3 >> 1 & 6;
  uVar1 = uVar5 + 8;
  if ((uVar3 & 0x90) == 0) {
    uVar1 = uVar5;
  }
  auVar6._0_4_ = -(uint)((env->vfp).qc[0] == 0);
  auVar6._4_4_ = -(uint)((env->vfp).qc[1] == 0);
  auVar6._8_4_ = -(uint)((env->vfp).qc[2] == 0);
  auVar6._12_4_ = -(uint)((env->vfp).qc[3] == 0);
  iVar4 = movmskps(uVar3 & 1,auVar6);
  return uVar3 >> 1 & 0x10 | (env->vfp).vec_stride << 0x14 |
         (env->vfp).vec_len << 0x10 | (env->vfp).xregs[1] | (uVar2 & 0x40) * 2 | uVar1 + (uVar3 & 1)
         | (uint)(iVar4 != 0xf) << 0x1b;
}

Assistant:

uint32_t HELPER(vfp_get_fpscr)(CPUARMState *env)
{
    uint32_t i, fpscr;

    fpscr = env->vfp.xregs[ARM_VFP_FPSCR]
            | (env->vfp.vec_len << 16)
            | (env->vfp.vec_stride << 20);

    fpscr |= vfp_get_fpscr_from_host(env);

    i = env->vfp.qc[0] | env->vfp.qc[1] | env->vfp.qc[2] | env->vfp.qc[3];
    fpscr |= i ? FPCR_QC : 0;

    return fpscr;
}